

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_modifiers.cc
# Opt level: O0

void __thiscall
ctemplate::CleanseAttribute::Modify
          (CleanseAttribute *this,char *in,size_t inlen,PerExpandData *param_3,ExpandEmitter *out,
          string *arg)

{
  char cVar1;
  int iVar2;
  ulong uStack_40;
  char c;
  size_t i;
  string *arg_local;
  ExpandEmitter *out_local;
  PerExpandData *param_3_local;
  size_t inlen_local;
  char *in_local;
  CleanseAttribute *this_local;
  
  uStack_40 = 0;
  do {
    if (inlen <= uStack_40) {
      return;
    }
    cVar1 = in[uStack_40];
    iVar2 = (int)cVar1;
    if ((iVar2 - 0x2dU < 2) || (iVar2 == 0x3a)) {
LAB_00176fde:
      (*out->_vptr_ExpandEmitter[2])(out,(ulong)(uint)(int)cVar1);
    }
    else if (iVar2 == 0x3d) {
      if ((uStack_40 == 0) || (uStack_40 == inlen - 1)) {
        (*out->_vptr_ExpandEmitter[2])(out,0x5f);
      }
      else {
        (*out->_vptr_ExpandEmitter[2])(out,(ulong)(uint)(int)cVar1);
      }
    }
    else {
      if (iVar2 == 0x5f) goto LAB_00176fde;
      if ((((cVar1 < 'a') || ('z' < cVar1)) && ((cVar1 < 'A' || ('Z' < cVar1)))) &&
         ((cVar1 < '0' || ('9' < cVar1)))) {
        (*out->_vptr_ExpandEmitter[5])(out,"_",1);
      }
      else {
        (*out->_vptr_ExpandEmitter[2])(out,(ulong)(uint)(int)cVar1);
      }
    }
    uStack_40 = uStack_40 + 1;
  } while( true );
}

Assistant:

void CleanseAttribute::Modify(const char* in, size_t inlen,
                              const PerExpandData*,
                              ExpandEmitter* out, const string& arg) const {
  for (size_t i = 0; i < inlen; ++i) {
    char c = in[i];
    switch (c) {
      case '=': {
        if (i == 0 || i == (inlen - 1))
          out->Emit('_');
        else
          out->Emit(c);
        break;
      }
      case '-':
      case '.':
      case '_':
      case ':': {
        out->Emit(c);
        break;
      }
      default: {
        if ((c >= 'a' && c <= 'z') ||
            (c >= 'A' && c <= 'Z') ||
            (c >= '0' && c <= '9')) {
          out->Emit(c);
        } else {
          APPEND("_");
        }
        break;
      }
    }
  }
}